

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Unmap(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int fVerbose;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar3 = false;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 == -1) {
      bVar3 = pAbc->pGia != (Gia_Man_t *)0x0;
      if (bVar3) {
        Vec_IntFreeP(&pAbc->pGia->vMapping);
        Vec_IntFreeP(&pAbc->pGia->vPacking);
        Vec_IntFreeP(&pAbc->pGia->vCellMapping);
        Vec_IntFreeP(&pAbc->pGia->vEdge1);
        Vec_IntFreeP(&pAbc->pGia->vEdge2);
      }
      else {
        Abc_Print(-1,"Abc_CommandAbc9Struct(): There is no AIG to map.\n");
      }
      pAbc_local._4_4_ = (uint)!bVar3;
      return pAbc_local._4_4_;
    }
    if ((iVar1 == 0x68) || (iVar1 != 0x76)) break;
    bVar3 = (bool)(bVar3 ^ 1);
  }
  Abc_Print(-2,"usage: &unmap [-vh]\n");
  Abc_Print(-2,"\t           removes mapping from the current network\n");
  pcVar2 = "no";
  if (bVar3) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Unmap( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManTestStruct( Gia_Man_t * p );
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Struct(): There is no AIG to map.\n" );
        return 1;
    }
    Vec_IntFreeP( &pAbc->pGia->vMapping );
    Vec_IntFreeP( &pAbc->pGia->vPacking );
    Vec_IntFreeP( &pAbc->pGia->vCellMapping );
    Vec_IntFreeP( &pAbc->pGia->vEdge1 );
    Vec_IntFreeP( &pAbc->pGia->vEdge2 );
    return 0;

usage:
    Abc_Print( -2, "usage: &unmap [-vh]\n" );
    Abc_Print( -2, "\t           removes mapping from the current network\n" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}